

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::Regexp::Decref(Regexp *this)

{
  int iVar1;
  Mutex *this_00;
  uint16_t uVar2;
  mapped_type *pmVar3;
  Regexp *local_20;
  
  this_00 = ref_mutex;
  if (this->ref_ == 0xffff) {
    Mutex::Lock(ref_mutex);
    local_20 = this;
    pmVar3 = std::
             map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
             ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                           *)ref_map,&local_20);
    iVar1 = *pmVar3 + -1;
    if (*pmVar3 < 0x10000) {
      this->ref_ = (uint16_t)iVar1;
      local_20 = this;
      std::
      _Rb_tree<re2::Regexp_*,_std::pair<re2::Regexp_*const,_int>,_std::_Select1st<std::pair<re2::Regexp_*const,_int>_>,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
      ::erase(ref_map,&local_20);
    }
    else {
      local_20 = this;
      pmVar3 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                             *)ref_map,&local_20);
      *pmVar3 = iVar1;
    }
    Mutex::Unlock(this_00);
  }
  else {
    uVar2 = this->ref_ - 1;
    this->ref_ = uVar2;
    if (uVar2 == 0) {
      Destroy(this);
      return;
    }
  }
  return;
}

Assistant:

void Regexp::Decref() {
  if (ref_ == kMaxRef) {
    // Ref count is stored in overflow map.
    MutexLock l(ref_mutex);
    int r = (*ref_map)[this] - 1;
    if (r < kMaxRef) {
      ref_ = static_cast<uint16_t>(r);
      ref_map->erase(this);
    } else {
      (*ref_map)[this] = r;
    }
    return;
  }
  ref_--;
  if (ref_ == 0)
    Destroy();
}